

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu382.c
# Opt level: O2

MPP_RET hal_h265d_vdpu382_gen_regs(void *hal,HalTaskInfo *syn)

{
  undefined1 *puVar1;
  HalBufs *bufs;
  ulong uVar2;
  byte bVar3;
  anon_union_4_2_0d70da0d_for_Vdpu382RegCommon_t_12 aVar4;
  ushort *puVar5;
  Vdpu382RegCommon *com;
  ushort *puVar6;
  RK_U64 *data;
  MppBuffer buffer;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  char cVar11;
  byte bVar12;
  ushort uVar13;
  RK_S32 RVar14;
  RK_U32 RVar15;
  MppFrameFormat MVar16;
  SW031_UV_SCALE_DOWN_TILE8x8_HOR_STRIDE SVar17;
  SWREG29_SCALE_DOWN_CTRL SVar18;
  SW032_Y_SCALE_DOWN_TILE8x8_HOR_STRIDE SVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  SWREG10_DEC_E SVar23;
  MPP_RET MVar24;
  long lVar25;
  void *pvVar26;
  HalBuf *pHVar27;
  void *pvVar28;
  size_t sVar29;
  undefined8 *puVar30;
  byte bVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  char *fname;
  FilterdColBufRatio (*paFVar35) [4];
  uint uVar36;
  char *fmt;
  HalH265dCtx *reg_ctx;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  short sVar40;
  ushort uVar41;
  uint uVar42;
  int iVar43;
  int iVar44;
  uint uVar45;
  RK_U32 RVar46;
  int iVar47;
  uint uVar48;
  ushort uVar49;
  uint *puVar50;
  RK_U64 RVar51;
  uint uVar52;
  ulong uVar53;
  DXVA_PicParams_HEVC *pp;
  MppBuffer framebuf;
  undefined8 local_100;
  MppBuffer streambuf;
  ulong local_f0;
  MppFrame mframe;
  ulong uStack_e0;
  undefined1 local_d8 [12];
  undefined4 uStack_cc;
  undefined1 auStack_c8 [12];
  ulong local_b0;
  void *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  Vdpu382RegCommonAddr *local_88;
  ulong local_80;
  RK_U16 column_width [20];
  BitputCtx_t bp;
  
  streambuf = (MppBuffer)0x0;
  framebuf = (MppBuffer)0x0;
  if ((((syn->dec).flags.val & 4) != 0) ||
     ((puVar5 = (ushort *)(syn->dec).syntax.data, ((syn->dec).flags.val & 8) != 0 &&
      (*(int *)(*(long *)((long)hal + 0x18) + 0x30) == 0)))) {
    if (((byte)hal_h265d_debug & 0x20) == 0) {
      return MPP_OK;
    }
    _mpp_log_l(4,"hal_h265d_vdpu382","%s found task error\n",(char *)0x0,
               "hal_h265d_vdpu382_gen_regs");
    return MPP_OK;
  }
  if (*(int *)((long)hal + 0x180) == 0) {
    (syn->dec).reg_index = 0;
LAB_001e7671:
    pvVar26 = mpp_buffer_get_ptr_with_caller
                        (*(MppBuffer *)((long)hal + 0x1c8),"hal_h265d_vdpu382_gen_regs");
    if (pvVar26 != (void *)0x0) {
      if ((syn->dec).syntax.data == (void *)0x0) {
        _mpp_log_l(2,"hal_h265d_vdpu382","%s:%s:%d dxva is NULL",(char *)0x0,
                   "/workspace/llm4binary/github/license_c_cmakelists/HermanChen[P]mpp/mpp/hal/rkdec/h265d/hal_h265d_vdpu382.c"
                   ,"hal_h265d_vdpu382_gen_regs",0x2c1);
        return MPP_ERR_NULL_PTR;
      }
      uVar20 = *(uint *)((long)hal + 0x200);
      com = *(Vdpu382RegCommon **)((long)hal + 0x100);
      memset(com,0,700);
      if (*(long *)((long)hal + 0x100) == 0) {
        return MPP_ERR_NULL_PTR;
      }
      bVar31 = (char)puVar5[4] + 3;
      local_98 = (ulong)((uint)*puVar5 << (bVar31 & 0x1f));
      local_a0 = (ulong)((uint)puVar5[1] << (bVar31 & 0x1f));
      puVar6 = (ushort *)(syn->dec).syntax.data;
      bVar31 = (char)*(undefined4 *)(puVar6 + 4) + 3;
      if (*(long *)((long)hal + 0x230) == 0) {
        RVar46 = 1;
      }
      else {
        RVar46 = *(uint *)(*(long *)((long)hal + 0x230) + 4) >> 0xe & 1;
      }
      RVar46 = vdpu382_get_colmv_size
                         ((uint)*puVar6 << (bVar31 & 0x1f),(uint)puVar6[1] << (bVar31 & 0x1f),
                          8 << (*(char *)((long)puVar6 + 9) + (char)*(undefined4 *)(puVar6 + 4) &
                               0x1fU) & 0xf8,0x10,0x10,RVar46);
      bufs = (HalBufs *)((long)hal + 0x1a8);
      if (*(HalBufs *)((long)hal + 0x1a8) == (HalBufs)0x0) {
        mframe = (MppFrame)CONCAT44(0,RVar46);
LAB_001e77d5:
        hal_bufs_init(bufs);
        if (*bufs == (HalBufs)0x0) {
          fmt = "colmv bufs init fail";
          fname = "hal_h265d_vdpu382_setup_colmv_buf";
          goto LAB_001e7746;
        }
        *(RK_U32 *)((long)hal + 0x1b0) = RVar46;
        RVar14 = mpp_buf_slot_get_count(*(MppBufSlots *)((long)hal + 0x20));
        *(RK_S32 *)((long)hal + 0x1b4) = RVar14;
        hal_bufs_setup(*(HalBufs *)((long)hal + 0x1a8),RVar14,1,(size_t *)&mframe);
      }
      else if (*(uint *)((long)hal + 0x1b0) < RVar46) {
        mframe = (MppFrame)CONCAT44(0,RVar46);
        hal_bufs_deinit(*(HalBufs *)((long)hal + 0x1a8));
        *bufs = (HalBufs)0x0;
        goto LAB_001e77d5;
      }
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uStack_e0;
      _mframe = auVar10 << 0x40;
      local_100 = bufs;
      mpp_buf_slot_get_prop
                (*(MppBufSlots *)((long)hal + 0x20),(byte)puVar5[3] & 0x7f,SLOT_FRAME_PTR,&mframe);
      RVar46 = mpp_frame_get_hor_stride(mframe);
      RVar15 = mpp_frame_get_ver_stride(mframe);
      puVar1 = &(com->reg013).field_0x2;
      *puVar1 = *puVar1 | 4;
      com->reg021 = (SWREG21_ERROR_CTRL_SET)((uint)com->reg021 & 0xfffffff8 | 6);
      com->reg017 = (SWREG17_SLICE_NUMBER)
                    ((uint)com->reg017 & 0xfe000000 | *(uint *)(puVar5 + 0xf2a) & 0x1ffffff);
      *(byte *)&com[1].reg008 = *(byte *)&com[1].reg008 & 0xf8;
      MVar16 = mpp_frame_get_fmt(mframe);
      if ((MVar16 & 0xf00000) == MPP_FMT_YUV420SP) {
        *(byte *)&com->reg012 = *(byte *)&com->reg012 & 0xfb;
        uVar53._0_4_ = com->reg018;
        uVar53._4_4_ = com->reg019;
        uVar53 = CONCAT44(RVar46 >> 4,RVar46 >> 4) & 0xffff0000ffff | uVar53 & (ulong)DAT_0028c310;
        com->reg018 = (SWREG18_Y_HOR_STRIDE)(int)uVar53;
        com->reg019 = (SWREG19_UV_HOR_STRIDE)(int)(uVar53 >> 0x20);
        uVar37 = RVar15 * RVar46 >> 4;
        uVar32 = 0xf0000000;
      }
      else {
        RVar46 = mpp_frame_get_fbc_hdr_stride(mframe);
        *(byte *)&com->reg012 = *(byte *)&com->reg012 | 4;
        uVar2._0_4_ = com->reg018;
        uVar2._4_4_ = com->reg019;
        uVar53 = CONCAT44(RVar46 >> 4,RVar46 >> 4) & 0xffff0000ffff | uVar2 & (ulong)DAT_0028c310;
        com->reg018 = (SWREG18_Y_HOR_STRIDE)(int)uVar53;
        com->reg019 = (SWREG19_UV_HOR_STRIDE)(int)(uVar53 >> 0x20);
        uVar37 = ((RVar15 + 0x40) * RVar46 >> 4) + 0xfff & 0x1ffff000;
        uVar32 = 0xf;
      }
      com->field_12 =
           (anon_union_4_2_0d70da0d_for_Vdpu382RegCommon_t_12)
           (uVar32 & (uint)com->field_12 | uVar37);
      mpp_buf_slot_get_prop
                (*(MppBufSlots *)((long)hal + 0x20),(byte)puVar5[3] & 0x7f,SLOT_BUFFER,&framebuf);
      SVar17 = (SW031_UV_SCALE_DOWN_TILE8x8_HOR_STRIDE)
               mpp_buffer_get_fd_with_caller(framebuf,"hal_h265d_vdpu382_gen_regs");
      com[2].reg031 = SVar17;
      if (SVar17 != (SW031_UV_SCALE_DOWN_TILE8x8_HOR_STRIDE)0x0) {
        SVar17 = (SW031_UV_SCALE_DOWN_TILE8x8_HOR_STRIDE)
                 mpp_buffer_get_fd_with_caller(framebuf,"hal_h265d_vdpu382_gen_regs");
        com[2].reg031 = SVar17;
        pHVar27 = hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x1a8),(byte)puVar5[3] & 0x7f);
        RVar46 = mpp_buffer_get_fd_with_caller(*pHVar27->buf,"hal_h265d_vdpu382_gen_regs");
        com[2].reg032_timeout_threshold = RVar46;
        com[1].reg009 = *(SWREG9_DEC_MODE *)(puVar5 + 0x3c);
        mpp_buf_slot_get_prop
                  (*(MppBufSlots *)((long)hal + 0x28),(syn->dec).input,SLOT_BUFFER,&streambuf);
        if (*(long *)(puVar5 + 0xf30) == 0) {
          pvVar28 = mpp_buffer_get_ptr_with_caller(streambuf,"hal_h265d_vdpu382_gen_regs");
          *(void **)(puVar5 + 0xf30) = pvVar28;
        }
        com[2].reg019 = (SWREG19_UV_HOR_STRIDE)((uint)com[2].reg019 | 0xffff);
        hal_h265d_slice_hw_rps
                  ((syn->dec).syntax.data,(void *)((long)pvVar26 + (ulong)uVar20),
                   *(void **)((long)hal + 0x210),*(RK_U32 *)((long)hal + 0x180));
        aVar4 = *(anon_union_4_2_0d70da0d_for_Vdpu382RegCommon_t_12 *)((long)hal + 0x1d0);
        com[4].reg026 = (SWREG26_BLOCK_GATING_EN_conflict)aVar4;
        com[3].reg018 = (SWREG18_Y_HOR_STRIDE)aVar4;
        com[3].field_12 = aVar4;
        SVar18 = (SWREG29_SCALE_DOWN_CTRL)
                 mpp_buffer_get_fd_with_caller(streambuf,"hal_h265d_vdpu382_gen_regs");
        com[2].reg029 = SVar18;
        SVar19 = (SW032_Y_SCALE_DOWN_TILE8x8_HOR_STRIDE)
                 mpp_buffer_get_fd_with_caller(streambuf,"hal_h265d_vdpu382_gen_regs");
        com[2].reg030 = SVar19;
        sVar29 = mpp_buffer_get_size_with_caller(streambuf,"hal_h265d_vdpu382_gen_regs");
        uVar20 = *(uint *)(puVar5 + 0xf34);
        uVar32 = (uVar20 + 0xf & 0xfffffff0) + 0x40;
        if ((uint)sVar29 <= uVar32) {
          uVar32 = (uint)sVar29;
        }
        com->reg016_str_len = uVar32;
        if (0 < (int)(uVar32 - uVar20)) {
          memset((void *)((ulong)uVar20 + *(long *)(puVar5 + 0xf30)),0,(ulong)(uVar32 - uVar20));
        }
        *(byte *)&com->reg010 = *(byte *)&com->reg010 | 1;
        if (*(long *)((long)hal + 0x230) == 0) {
          uVar20 = 0;
        }
        else {
          uVar20 = *(uint *)(*(long *)((long)hal + 0x230) + 4) >> 0xd & 2;
        }
        local_88 = (Vdpu382RegCommonAddr *)&com[2].reg029;
        SVar17 = com[2].reg031;
        com->reg012 = (SWREG12_SENCODARY_EN_conflict)((uint)com->reg012 & 0xfffffffd | uVar20);
        com->reg024 = (SWREG24_CABAC_ERROR_EN_LOWBITS)0xffffdfff;
        com->reg025 = (SWREG25_CABAC_ERROR_EN_HIGHBITS)((uint)com->reg025 & 0xc0000000 | 0x3ffbf9ff)
        ;
        com->reg011 = (SWREG11_IMPORTANT_EN_conflict)((uint)com->reg011 | 0xc00002);
        com->reg026 = (SWREG26_BLOCK_GATING_EN_conflict)((uint)com->reg026 | 0x80030f1f);
        com->reg032_timeout_threshold = 0x3ffff;
        *(byte *)((long)hal + (long)(syn->dec).reg_index + 0x1c3) = (byte)puVar5[3] & 0x7f;
        com[2].reg033 = (SW033_LINE_IRQ_CTRL)SVar17;
        com[4].reg034 = (SW034_SCALE_DOWN_ROI_OFFSET)0x0;
        iVar33 = 0x7fffffff;
        puVar50 = &DAT_00291fb0;
        for (lVar25 = 0x7c; lVar25 != 0x8b; lVar25 = lVar25 + 1) {
          if ((*(byte *)((long)puVar5 + lVar25) | 0x80) != 0xff) {
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uStack_e0;
            _mframe = auVar7 << 0x40;
            *(undefined4 *)((long)com + lVar25 * 4 + -0x174) =
                 *(undefined4 *)(puVar5 + lVar25 * 2 + -0xb2);
            mpp_buf_slot_get_prop
                      (*(MppBufSlots *)((long)hal + 0x20),*(byte *)((long)puVar5 + lVar25) & 0x7f,
                       SLOT_BUFFER,&framebuf);
            mpp_buf_slot_get_prop
                      (*(MppBufSlots *)((long)hal + 0x20),*(byte *)((long)puVar5 + lVar25) & 0x7f,
                       SLOT_FRAME_PTR,&mframe);
            if (framebuf == (MppBuffer)0x0) {
              *(SW031_UV_SCALE_DOWN_TILE8x8_HOR_STRIDE *)((long)com + lVar25 * 4 + -0x6c) = SVar17;
            }
            else {
              SVar17 = (SW031_UV_SCALE_DOWN_TILE8x8_HOR_STRIDE)
                       mpp_buffer_get_fd_with_caller(framebuf,"hal_h265d_vdpu382_gen_regs");
              *(SW031_UV_SCALE_DOWN_TILE8x8_HOR_STRIDE *)((long)com + lVar25 * 4 + -0x6c) = SVar17;
              iVar21 = *(int *)(puVar5 + lVar25 * 2 + -0xb2) - *(int *)(puVar5 + 0x7a);
              iVar22 = -iVar21;
              if (0 < iVar21) {
                iVar22 = iVar21;
              }
              if (iVar22 < iVar33) {
                RVar46 = mpp_frame_get_errinfo(mframe);
                if (RVar46 == 0) {
                  iVar22 = *(int *)(puVar5 + lVar25 * 2 + -0xb2) - *(int *)(puVar5 + 0x7a);
                  iVar33 = -iVar22;
                  if (0 < iVar22) {
                    iVar33 = iVar22;
                  }
                  com[2].reg033 = *(SW033_LINE_IRQ_CTRL *)((long)com + lVar25 * 4 + -0x6c);
                  *(byte *)((long)hal + (long)(syn->dec).reg_index + 0x1c3) =
                       *(byte *)((long)puVar5 + lVar25) & 0x7f;
                  *(byte *)&com->reg021 = *(byte *)&com->reg021 & 0xfd;
                }
              }
            }
            pHVar27 = hal_bufs_get_buf(*local_100,*(byte *)((long)puVar5 + lVar25) & 0x7f);
            iVar22 = mpp_buffer_get_fd_with_caller(*pHVar27->buf,"hal_h265d_vdpu382_gen_regs");
            *(int *)((long)com + lVar25 * 4 + -0x28) = iVar22;
            com[2].reg015 = (SWREG15_STREAM_PARAM_SET_conflict)((uint)com[2].reg015 | *puVar50);
          }
          puVar50 = puVar50 + 1;
        }
        if ((*(byte *)((long)hal + (long)(syn->dec).reg_index + 0x1c3) != ((byte)puVar5[3] & 0x7f))
           || ((puVar5[0xf] & 4) != 0)) {
          for (uVar53 = 0; uVar53 != 0xf; uVar53 = uVar53 + 1) {
            bVar31 = *(byte *)((long)puVar5 + uVar53 + 0x7c);
            if ((bVar31 | 0x80) == 0xff) {
              pHVar27 = hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x1a8),
                                         (uint)*(byte *)((long)hal +
                                                        (long)(syn->dec).reg_index + 0x1c3));
              *(SW033_LINE_IRQ_CTRL *)(&com[3].reg021 + uVar53) = com[2].reg033;
              SVar23 = (SWREG10_DEC_E)
                       mpp_buffer_get_fd_with_caller(*pHVar27->buf,"hal_h265d_vdpu382_gen_regs");
              (&com[4].reg010)[uVar53] = SVar23;
              if (*(byte *)((long)hal + (long)(syn->dec).reg_index + 0x1c3) ==
                  ((byte)puVar5[3] & 0x7f)) {
                MVar24 = (*(code *)((long)&DAT_00291eb0 +
                                   (long)(int)(&DAT_00291eb0)[uVar53 & 0xffffffff]))();
                return MVar24;
              }
            }
            else {
              auVar8._8_8_ = 0;
              auVar8._0_8_ = uStack_e0;
              _mframe = auVar8 << 0x40;
              mpp_buf_slot_get_prop
                        (*(MppBufSlots *)((long)hal + 0x20),bVar31 & 0x7f,SLOT_BUFFER,&framebuf);
              mpp_buf_slot_get_prop
                        (*(MppBufSlots *)((long)hal + 0x20),
                         *(byte *)((long)puVar5 + uVar53 + 0x7c) & 0x7f,SLOT_FRAME_PTR,&mframe);
              if (framebuf != (MppBuffer)0x0) {
                RVar46 = mpp_frame_get_errinfo(mframe);
                if (RVar46 == 0) goto LAB_001e7fb6;
              }
              pHVar27 = hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x1a8),
                                         (uint)*(byte *)((long)hal +
                                                        (long)(syn->dec).reg_index + 0x1c3));
              *(SW033_LINE_IRQ_CTRL *)(&com[3].reg021 + uVar53) = com[2].reg033;
              SVar23 = (SWREG10_DEC_E)
                       mpp_buffer_get_fd_with_caller(*pHVar27->buf,"hal_h265d_vdpu382_gen_regs");
              (&com[4].reg010)[uVar53] = SVar23;
            }
LAB_001e7fb6:
          }
          puVar6 = (ushort *)(syn->dec).syntax.data;
          if (puVar6 == (ushort *)0x0) {
            _mpp_log_l(2,"hal_h265d_vdpu382","%s:%s:%d reg_ctx or dxva_cxt is NULL",(char *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/HermanChen[P]mpp/mpp/hal/rkdec/h265d/hal_h265d_vdpu382.c"
                       ,"hal_h265d_v382_output_pps_packet",0xe4);
          }
          else {
            local_100 = *(HalBufs **)((long)hal + 0x100);
            pvVar26 = mpp_buffer_get_ptr_with_caller
                                (*(MppBuffer *)((long)hal + 0x1c8),
                                 "hal_h265d_v382_output_pps_packet");
            uVar53 = (ulong)*(uint *)((long)hal + 0x1fc);
            if ((char)puVar6[0xd35] != '\0') {
              if (pvVar26 == (void *)0x0) {
                _mpp_log_l(2,"hal_h265d_vdpu382","pps_data get ptr error",(char *)0x0);
                goto LAB_001e8654;
              }
              data = *(RK_U64 **)((long)hal + 0x208);
              for (lVar25 = 0; lVar25 != 0xe; lVar25 = lVar25 + 1) {
                data[lVar25] = 0;
              }
              local_b0 = uVar53;
              local_a8 = pvVar26;
              mpp_set_bitput_ctx(&bp,data,0xe);
              mpp_put_bits(&bp,(ulong)*(uint *)(puVar6 + 0x74),4);
              mpp_put_bits(&bp,(ulong)*(uint *)(puVar6 + 0x78),4);
              mpp_put_bits(&bp,(ulong)(puVar6[2] & 3),2);
              local_80 = (ulong)(byte)puVar6[4];
              iVar33 = (byte)puVar6[4] + 3;
              bVar31 = (byte)iVar33;
              uVar20 = (uint)*puVar6 << (bVar31 & 0x1f);
              local_f0 = (ulong)uVar20;
              uVar32 = (uint)puVar6[1] << (bVar31 & 0x1f);
              mpp_put_bits(&bp,(long)(int)uVar20,0x10);
              local_90 = (ulong)uVar32;
              mpp_put_bits(&bp,(long)(int)uVar32,0x10);
              mpp_put_bits(&bp,(ulong)(puVar6[2] >> 3 & 7) | 8,4);
              mpp_put_bits(&bp,(ulong)(puVar6[2] >> 6 & 7) | 8,4);
              mpp_put_bits(&bp,(ulong)(puVar6[2] >> 9 & 0xf) + 4,5);
              mpp_put_bits(&bp,(ulong)*(byte *)((long)puVar6 + 9),2);
              mpp_put_bits(&bp,(ulong)(byte)puVar6[4] + 3,3);
              mpp_put_bits(&bp,(ulong)(byte)puVar6[5] + 2,3);
              mpp_put_bits(&bp,(ulong)*(byte *)((long)puVar6 + 0xb),2);
              mpp_put_bits(&bp,(ulong)(byte)puVar6[6],3);
              mpp_put_bits(&bp,(ulong)*(byte *)((long)puVar6 + 0xd),3);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xc) & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xc) >> 1 & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xc) >> 2 & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xc) >> 3 & 1),1);
              mpp_put_bits(&bp,(ulong)((*(uint *)(puVar6 + 0xc) >> 4 & 0xf) + 1 &
                                      (int)(*(uint *)(puVar6 + 0xc) << 0x1c) >> 0x1f),4);
              mpp_put_bits(&bp,(ulong)((*(uint *)(puVar6 + 0xc) >> 8 & 0xf) + 1 &
                                      (int)(*(uint *)(puVar6 + 0xc) << 0x1c) >> 0x1f),4);
              mpp_put_bits(&bp,(ulong)(puVar6[0xd] & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xc) >> 0xe & 3),3);
              mpp_put_bits(&bp,(ulong)((*(uint *)(puVar6 + 0xc) >> 0xc & 3) + 3 &
                                      (int)(*(uint *)(puVar6 + 0xc) << 0x1c) >> 0x1f),3);
              mpp_put_bits(&bp,(ulong)(byte)puVar6[7],7);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xc) >> 0x11 & 1),1);
              mpp_put_bits(&bp,(ulong)*(byte *)((long)puVar6 + 0xf),6);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xc) >> 0x12 & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xc) >> 0x13 & 1),1);
              mpp_put_bits(&bp,0,7);
              mpp_put_bits(&bp,(ulong)*(byte *)((long)puVar6 + 7),4);
              mpp_put_bits(&bp,0,3);
              mpp_put_align(&bp,0x20,0xf);
              mpp_put_bits(&bp,(ulong)*(uint *)(puVar6 + 0x76),6);
              mpp_put_bits(&bp,(ulong)*(uint *)(puVar6 + 0x78),4);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xc) >> 0x14 & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xc) >> 0x15 & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xc) >> 0x16 & 7),0xd);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xc) >> 0x19 & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xc) >> 0x1a & 1),1);
              mpp_put_bits(&bp,(ulong)(byte)puVar6[8] + 1,4);
              mpp_put_bits(&bp,(ulong)*(byte *)((long)puVar6 + 0x11) + 1,4);
              mpp_put_bits(&bp,(long)(char)puVar6[9],7);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) >> 1 & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) >> 2 & 1),1);
              mpp_put_bits(&bp,(ulong)(((int)local_80 + (uint)*(byte *)((long)puVar6 + 9) + 3) -
                                      (uint)(byte)puVar6[0x3a]),3);
              if (((byte)hal_h265d_debug & 4) != 0) {
                _mpp_log_l(4,"hal_h265d_vdpu382","log2_min_cb_size %d %d %d \n",(char *)0x0,iVar33,
                           (ulong)*(byte *)((long)puVar6 + 9),(uint)(byte)puVar6[0x3a]);
              }
              mpp_put_bits(&bp,(long)(char)puVar6[0x10],5);
              mpp_put_bits(&bp,(long)*(char *)((long)puVar6 + 0x21),5);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) >> 3 & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) >> 4 & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) >> 5 & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) >> 6 & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) >> 7 & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) >> 8 & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) >> 0xb & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) >> 10 & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) >> 0xc & 1),1);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) >> 0xd & 1),1);
              mpp_put_bits(&bp,(long)*(char *)((long)puVar6 + 0x75),4);
              mpp_put_bits(&bp,(long)(char)puVar6[0x3b],4);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) >> 0xe & 1),1);
              mpp_put_bits(&bp,(ulong)*(byte *)((long)puVar6 + 0x77) + 2,3);
              mpp_put_bits(&bp,(ulong)(*(uint *)(puVar6 + 0xe) >> 0xf & 1),1);
              RVar51 = 0;
              mpp_put_bits(&bp,0,3);
              if ((puVar6[0xe] & 0x80) != 0) {
                RVar51 = (ulong)(byte)puVar6[0x11] + 1;
              }
              mpp_put_bits(&bp,RVar51,5);
              if ((puVar6[0xe] & 0x80) == 0) {
                RVar51 = 0;
              }
              else {
                RVar51 = (ulong)*(byte *)((long)puVar6 + 0x23) + 1;
              }
              mpp_put_bits(&bp,RVar51,5);
              mpp_put_bits(&bp,0,4);
              mpp_put_align(&bp,0x40,0xf);
              column_width[0] = 0;
              column_width[1] = 0;
              column_width[2] = 0;
              column_width[3] = 0;
              column_width[4] = 0;
              column_width[5] = 0;
              column_width[6] = 0;
              column_width[7] = 0;
              column_width[8] = 0;
              column_width[9] = 0;
              column_width[10] = 0;
              column_width[0xb] = 0;
              column_width[0xc] = 0;
              column_width[0xd] = 0;
              column_width[0xe] = 0;
              column_width[0xf] = 0;
              column_width[0x10] = 0;
              column_width[0x11] = 0;
              column_width[0x12] = 0;
              column_width[0x13] = 0;
              _mframe = (undefined1  [16])0x0;
              local_d8 = SUB1612((undefined1  [16])0x0,0);
              uStack_cc = 0;
              auStack_c8 = SUB1612((undefined1  [16])0x0,4);
              iVar33 = (int)local_90;
              if ((char)*(uint *)(puVar6 + 0xe) < '\0') {
                iVar21 = 1 << (bVar31 + *(char *)((long)puVar6 + 9) & 0x1f);
                iVar22 = (int)local_f0 + -1 + iVar21;
                if ((*(uint *)(puVar6 + 0xe) >> 9 & 1) == 0) {
                  uVar49 = puVar6[0x11];
                  sVar40 = 0;
                  for (uVar53 = 0; (byte)uVar49 != uVar53; uVar53 = uVar53 + 1) {
                    uVar13 = puVar6[uVar53 + 0x12];
                    column_width[uVar53] = uVar13 + 1;
                    sVar40 = sVar40 + uVar13 + 1;
                  }
                  column_width[(byte)uVar49] = (short)(iVar22 / iVar21) - sVar40;
                  bVar31 = *(byte *)((long)puVar6 + 0x23);
                  sVar40 = 0;
                  for (uVar53 = 0; bVar31 != uVar53; uVar53 = uVar53 + 1) {
                    uVar49 = puVar6[uVar53 + 0x25];
                    *(ushort *)((long)&mframe + uVar53 * 2) = uVar49 + 1;
                    sVar40 = sVar40 + uVar49 + 1;
                  }
                  *(short *)((long)&mframe + (ulong)bVar31 * 2) =
                       (short)((iVar33 + -1 + iVar21) / iVar21) - sVar40;
                }
                else {
                  lVar25 = (ulong)(byte)puVar6[0x11] + 1;
                  iVar44 = 0;
                  for (lVar34 = 0; lVar25 != lVar34; lVar34 = lVar34 + 1) {
                    iVar43 = iVar22 / iVar21 + iVar44;
                    iVar47 = (int)lVar25;
                    column_width[lVar34] = (short)(iVar43 / iVar47) - (short)(iVar44 / iVar47);
                    iVar44 = iVar43;
                  }
                  lVar25 = (ulong)*(byte *)((long)puVar6 + 0x23) + 1;
                  iVar22 = 0;
                  for (lVar34 = 0; lVar25 != lVar34; lVar34 = lVar34 + 1) {
                    iVar44 = (iVar33 + -1 + iVar21) / iVar21 + iVar22;
                    iVar43 = (int)lVar25;
                    *(short *)((long)&mframe + lVar34 * 2) =
                         (short)(iVar44 / iVar43) - (short)(iVar22 / iVar43);
                    iVar22 = iVar44;
                  }
                }
              }
              else {
                iVar22 = 1 << (bVar31 + *(char *)((long)puVar6 + 9) & 0x1f);
                column_width._2_14_ = SUB1614((undefined1  [16])0x0,2);
                column_width[0] = (RK_U16)(((int)local_f0 + iVar22 + -1) / iVar22);
                stack0xffffffffffffff1a = SUB1614((undefined1  [16])0x0,2);
                mframe._0_2_ = (short)((iVar33 + iVar22 + -1) / iVar22);
              }
              for (lVar25 = 0; uVar53 = local_b0, lVar25 != 0x14; lVar25 = lVar25 + 1) {
                if (column_width[lVar25] == 0) {
                  RVar51 = 0;
                }
                else {
                  uVar49 = column_width[lVar25] - 1;
                  column_width[lVar25] = uVar49;
                  RVar51 = (RK_U64)uVar49;
                }
                mpp_put_bits(&bp,RVar51,0xc);
              }
              for (lVar25 = 0; lVar25 != 0x16; lVar25 = lVar25 + 1) {
                sVar40 = *(short *)((long)&mframe + lVar25 * 2);
                if (sVar40 == 0) {
                  RVar51 = 0;
                }
                else {
                  uVar49 = sVar40 - 1;
                  *(ushort *)((long)&mframe + lVar25 * 2) = uVar49;
                  RVar51 = (RK_U64)uVar49;
                }
                mpp_put_bits(&bp,RVar51,0xc);
              }
              mpp_put_bits(&bp,0,0x20);
              mpp_put_bits(&bp,0,0x46);
              mpp_put_align(&bp,0x40,0xf);
              pvVar26 = local_a8;
            }
            if ((puVar6[0xc] & 1) != 0) {
              pvVar28 = mpp_buffer_get_ptr_with_caller
                                  (*(MppBuffer *)((long)hal + 0x1c8),
                                   "hal_h265d_v382_output_pps_packet");
              if (*(char *)((long)puVar6 + 0x1a69) == '\0') {
                uVar20 = 0x1a900;
                if ((puVar6[0xc] & 1) != 0) {
                  uVar20 = *(int *)(puVar6 + 0x78) * 0x550;
                }
              }
              else {
                uVar20 = *(int *)(puVar6 + 0x76) * 0x550 + 0x5500;
              }
              hal_h265d_output_scalinglist_packet
                        (hal,(void *)((long)pvVar28 +
                                     (ulong)uVar20 + (ulong)*(uint *)((long)hal + 0x204)),puVar6);
              *(undefined4 *)((long)local_100 + 0x1c4) = *(undefined4 *)((long)hal + 0x1d0);
              *(byte *)((long)local_100 + 0x11) = *(byte *)((long)local_100 + 0x11) | 1;
              mpp_dev_set_reg_offset
                        (*(MppDev *)((long)hal + 0x10),0xb4,uVar20 + *(int *)((long)hal + 0x204));
            }
            for (lVar25 = -0x1c00; lVar25 != 0; lVar25 = lVar25 + 0x70) {
              memcpy((void *)((long)pvVar26 + lVar25 + uVar53 + 0x1c00),
                     *(void **)((long)hal + 0x208),0x70);
            }
          }
LAB_001e8654:
          mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0xa1,*(RK_U32 *)((long)hal + 0x1fc));
          mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0xa3,*(RK_U32 *)((long)hal + 0x200));
          com->reg013 = (SWREG13_EN_MODE_SET_conflict)
                        ((uint)com->reg013 & 0xfeffffff | (*(uint *)(puVar5 + 0xe) & 0x20000) << 7);
          *(byte *)&com->reg011 = *(byte *)&com->reg011 | 0x40;
          uVar49 = puVar5[2];
          uVar13 = uVar49 >> 3 & 7;
          uVar41 = uVar49 >> 6 & 7;
          bVar31 = (byte)uVar41;
          if (uVar41 < uVar13) {
            bVar31 = (byte)uVar13;
          }
          uVar32 = 8 << (*(char *)((long)puVar5 + 9) + (char)*(undefined4 *)(puVar5 + 4) & 0x1fU);
          uVar20 = *(byte *)((long)puVar5 + 0x23) + 1;
          iVar22 = (int)local_98;
          iVar33 = (int)local_a0;
          if (((((uVar20 != *(byte *)((long)hal + 0x1c1)) ||
                (*(byte *)((long)hal + 0x1c2) != (bVar31 | 8))) ||
               (*(uint *)((long)hal + 0x1bc) != (uVar49 & 3))) ||
              (((uVar32 & 0xf8) != (uint)*(byte *)((long)hal + 0x1c0) ||
               (*(int *)((long)hal + 0x58) != iVar22)))) || (*(int *)((long)hal + 0x5c) != iVar33))
          {
            local_b0 = CONCAT44(local_b0._4_4_,uVar20);
            local_a8 = (void *)CONCAT44(local_a8._4_4_,uVar32);
            local_100 = (HalBufs *)(CONCAT44(local_100._4_4_,(uint)uVar49) & 0xffffffff00000003);
            local_f0 = CONCAT71(local_f0._1_7_,*(int *)((long)hal + 0x180) != 0);
            RVar14 = vdpu382_get_rcb_buf_size((Vdpu382RcbInfo *)((long)hal + 100),iVar22,iVar33);
            *(RK_S32 *)((long)hal + 0x60) = RVar14;
            uVar49 = puVar5[2];
            uVar37 = uVar49 & 3;
            uVar32 = uVar49 >> 3 & 7;
            uVar20 = uVar49 >> 6 & 7;
            if ((ushort)uVar20 < (ushort)uVar32) {
              uVar20 = uVar32;
            }
            uVar38 = 8 << (*(char *)((long)puVar5 + 9) + (char)*(undefined4 *)(puVar5 + 4) & 0x1fU);
            bVar3 = (byte)puVar5[0x11];
            iVar21 = (uint)bVar3 * 0x200;
            uVar42 = uVar38 & 0xff;
            uVar39 = -uVar42;
            uVar48 = (uVar42 + iVar22) - 1 & uVar39;
            uVar45 = (uVar42 + iVar33) - 1 & uVar39;
            uVar32 = 0;
            uVar36 = 0;
            uVar52 = 0;
            if (0x1fff < (int)uVar48) {
              uVar36 = (uint)(byte)(0x40 / (byte)uVar38);
              uVar36 = ((((((uVar42 - 1) + uVar48 & uVar39) + uVar36) - 1) / uVar36) * 0x18 + iVar21
                       >> 3) + 0x3f & 0xffffffc0;
              uVar52 = ((uVar48 * 2 - 0x3ffa & 0xfffffff0) + iVar21 >> 3) + 0x3f & 0xffffffc0;
            }
            iVar33 = uVar20 + 8;
            *(uint *)((long)hal + 0x8c) = uVar36;
            *(uint *)((long)hal + 0x80) = uVar52;
            if ((0x1fff < (int)uVar45) && (bVar3 != 0)) {
              uVar32 = (uVar45 * 2 - 0x3ffa >> 4) * 2 + 0x3f & 0xffffffc0;
            }
            *(uint *)((long)hal + 0xbc) = uVar32;
            *(uint *)((long)hal + 0x98) = (uVar48 * 0x16 + iVar21 >> 3) + 0x3f & 0xffffffc0;
            uVar32 = 0;
            if (bVar3 != 0) {
              uVar32 = (uVar45 * 0x16 >> 3) + 0x3f & 0xffffffc0;
            }
            *(uint *)((long)hal + 200) = uVar32;
            uVar49 = (short)uVar37 - 1;
            *(uint *)((long)hal + 0x74) =
                 ((uVar48 << ((short)uVar37 != 0)) * 0xb + iVar21 >> 3) + 0x3f & 0xffffffc0;
            if (uVar49 < 2) {
              cVar11 = (char)iVar33 * '\x06';
              if (uVar42 == 0x20) {
                bVar12 = cVar11 + 4;
              }
              else {
                bVar12 = cVar11 + 2;
              }
            }
            else {
              bVar12 = (char)iVar33 << 3;
              if (uVar42 == 0x20) {
                bVar12 = bVar12 | 4;
              }
              else {
                bVar12 = bVar12 | 2;
              }
            }
            uVar32 = (uint)((short)uVar20 == 0);
            uVar53 = local_f0 & 0xff;
            *(uint *)((long)hal + 0x68) =
                 ((uVar32 * 0x40 + 0x2c0) * (uint)bVar3 + bVar12 * uVar48 >> 3) + 0x3f & 0xffffffc0;
            iVar22 = iVar33 * 3;
            if (uVar49 < 2) {
              iVar22 = iVar33 * 2;
            }
            *(uint *)((long)hal + 0xa4) =
                 ((uVar32 | 0x14) * 0x20 * (uint)bVar3 +
                  (iVar22 + (uint)(byte)(0x80 / (byte)uVar38)) * uVar48 >> 3) + 0x3f & 0xffffffc0;
            uVar32 = 0;
            uVar36 = 0;
            if (((uint)com->reg012 & 4) != 0) {
              uVar36 = (((uint)bVar3 << ((short)uVar20 == 0 | 6U)) + iVar21 +
                        (uVar37 * 2 + -2) * uVar48 * iVar33 >> 3) + 0x3f & 0xffffffc0;
            }
            *(uint *)((long)hal + 0xb0) = uVar36;
            if (bVar3 != 0) {
              paFVar35 = filterd_fbc_on;
              if (((uint)com->reg012 & 4) == 0) {
                paFVar35 = filterd_fbc_off;
              }
              uVar32 = ((iVar33 * *(int *)((long)&(*paFVar35)[uVar37].a + (ulong)(uVar38 & 0xe0)) +
                        *(int *)((long)&(*paFVar35)[uVar37].b + (ulong)(uVar38 & 0xe0))) * uVar45 >>
                       3) + 0x3f & 0xffffffc0;
            }
            *(uint *)((long)hal + 0xd4) = uVar32;
            for (lVar25 = 0; uVar53 * 2 + 1 != lVar25; lVar25 = lVar25 + 1) {
              buffer = *(MppBuffer *)((long)hal + lVar25 * 8 + 0xe8);
              if (buffer != (MppBuffer)0x0) {
                mpp_buffer_put_with_caller(buffer,"hal_h265d_rcb_info_update");
                *(undefined8 *)((long)hal + lVar25 * 8 + 0xe8) = 0;
              }
              mpp_buffer_get_with_tag
                        (*(MppBufferGroup *)((long)hal + 0x30),&mframe,
                         (long)*(int *)((long)hal + 0x60),"hal_h265d_vdpu382",
                         "hal_h265d_rcb_info_update");
              *(MppFrame *)((long)hal + lVar25 * 8 + 0xe8) = mframe;
            }
            *(char *)((long)hal + 0x1c1) = (char)local_b0;
            *(byte *)((long)hal + 0x1c2) = bVar31 | 8;
            *(undefined4 *)((long)hal + 0x1bc) = (undefined4)local_100;
            *(char *)((long)hal + 0x1c0) = (char)local_a8;
            *(int *)((long)hal + 0x58) = (int)local_98;
            *(int *)((long)hal + 0x5c) = (int)local_a0;
          }
          puVar30 = (undefined8 *)((long)hal + 0xe8);
          if (*(int *)((long)hal + 0x180) != 0) {
            puVar30 = puVar30 + (syn->dec).reg_index;
          }
          vdpu382_setup_rcb(local_88,*(MppDev *)((long)hal + 0x10),(MppBuffer)*puVar30,
                            (Vdpu382RcbInfo *)((long)hal + 100));
          auVar9._8_8_ = 0;
          auVar9._0_8_ = uStack_e0;
          _mframe = auVar9 << 0x40;
          mpp_buf_slot_get_prop
                    (*(MppBufSlots *)((long)hal + 0x20),(byte)puVar5[3] & 0x7f,SLOT_FRAME_PTR,
                     &mframe);
          RVar46 = mpp_frame_get_thumbnail_en(mframe);
          if (RVar46 == 0) {
            com[4].reg027 = (SW027_CORE_SAFE_PIXELS)0x0;
            com[4].reg028 = (SWREG28_MULTIPLY_CORE_CTRL)0x0;
            puVar1 = &(com->reg012).field_0x1;
            *puVar1 = *puVar1 & 0xfd;
          }
          else {
            SVar17 = com[2].reg031;
            com[4].reg027 = (SW027_CORE_SAFE_PIXELS)SVar17;
            com[4].reg028 = (SWREG28_MULTIPLY_CORE_CTRL)SVar17;
            vdpu382_setup_down_scale(mframe,*(MppDev *)((long)hal + 0x10),com);
          }
          vdpu382_setup_statistic(com,(Vdpu382RegStatistic *)&com[5].reg021);
          mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x1c8),0,"hal_h265d_vdpu382_gen_regs");
          return MPP_OK;
        }
        if (((byte)hal_h265d_debug & 0x20) != 0) {
          _mpp_log_l(4,"hal_h265d_vdpu382","current frm may be err, should skip process",(char *)0x0
                    );
        }
        *(byte *)&(syn->dec).flags = *(byte *)&(syn->dec).flags | 8;
      }
      return MPP_OK;
    }
    fmt = "rps_data get ptr error";
  }
  else {
    lVar25 = -0x1e;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      if (*(int *)((long)hal + lVar25 * 4 + 0x180) == 0) {
        (syn->dec).reg_index = (RK_S32)lVar34;
        *(undefined4 *)((long)hal + 0x1fc) = *(undefined4 *)((long)hal + lVar34 * 4 + 0x1d8);
        *(undefined4 *)((long)hal + 0x200) = *(undefined4 *)((long)hal + lVar34 * 4 + 0x1e4);
        *(undefined4 *)((long)hal + 0x204) = *(undefined4 *)((long)hal + lVar34 * 4 + 0x1f0);
        *(undefined8 *)((long)hal + 0x100) = *(undefined8 *)((long)hal + lVar25 * 4 + 0x1a0);
        *(undefined4 *)((long)hal + lVar25 * 4 + 0x180) = 1;
        goto LAB_001e7671;
      }
      lVar25 = lVar25 + 10;
    }
    fmt = "hevc rps buf all used";
  }
  fname = (char *)0x0;
LAB_001e7746:
  _mpp_log_l(2,"hal_h265d_vdpu382",fmt,fname);
  return MPP_ERR_NOMEM;
}

Assistant:

static MPP_RET hal_h265d_vdpu382_gen_regs(void *hal,  HalTaskInfo *syn)
{
    RK_S32 i = 0;
    RK_S32 log2_min_cb_size;
    RK_S32 width, height;
    RK_S32 stride_y, stride_uv, virstrid_y;
    Vdpu382H265dRegSet *hw_regs;
    RK_S32 ret = MPP_SUCCESS;
    MppBuffer streambuf = NULL;
    RK_S32 aglin_offset = 0;
    RK_S32 valid_ref = -1;
    MppBuffer framebuf = NULL;
    HalBuf *mv_buf = NULL;
    RK_S32 fd = -1;
    RK_S32 distance = INT_MAX;
    h265d_dxva2_picture_context_t *dxva_cxt =
        (h265d_dxva2_picture_context_t *)syn->dec.syntax.data;
    HalH265dCtx *reg_ctx = ( HalH265dCtx *)hal;
    void *rps_ptr = NULL;
    RK_U32 stream_buf_size = 0;

    if (syn->dec.flags.parse_err ||
        (syn->dec.flags.ref_err && !reg_ctx->cfg->base.disable_error)) {
        h265h_dbg(H265H_DBG_TASK_ERR, "%s found task error\n", __FUNCTION__);
        return MPP_OK;
    }

    if (reg_ctx ->fast_mode) {
        for (i = 0; i < MAX_GEN_REG; i++) {
            if (!reg_ctx->g_buf[i].use_flag) {
                syn->dec.reg_index = i;

                reg_ctx->spspps_offset = reg_ctx->offset_spspps[i];
                reg_ctx->rps_offset = reg_ctx->offset_rps[i];
                reg_ctx->sclst_offset = reg_ctx->offset_sclst[i];

                reg_ctx->hw_regs = reg_ctx->g_buf[i].hw_regs;
                reg_ctx->g_buf[i].use_flag = 1;
                break;
            }
        }
        if (i == MAX_GEN_REG) {
            mpp_err("hevc rps buf all used");
            return MPP_ERR_NOMEM;
        }
    } else {
        syn->dec.reg_index = 0;
    }
    rps_ptr = mpp_buffer_get_ptr(reg_ctx->bufs) + reg_ctx->rps_offset;
    if (NULL == rps_ptr) {

        mpp_err("rps_data get ptr error");
        return MPP_ERR_NOMEM;
    }


    if (syn->dec.syntax.data == NULL) {
        mpp_err("%s:%s:%d dxva is NULL", __FILE__, __FUNCTION__, __LINE__);
        return MPP_ERR_NULL_PTR;
    }

    /* output pps */
    hw_regs = (Vdpu382H265dRegSet*)reg_ctx->hw_regs;
    memset(hw_regs, 0, sizeof(Vdpu382H265dRegSet));

    if (NULL == reg_ctx->hw_regs) {
        return MPP_ERR_NULL_PTR;
    }


    log2_min_cb_size = dxva_cxt->pp.log2_min_luma_coding_block_size_minus3 + 3;

    width = (dxva_cxt->pp.PicWidthInMinCbsY << log2_min_cb_size);
    height = (dxva_cxt->pp.PicHeightInMinCbsY << log2_min_cb_size);
    ret = hal_h265d_vdpu382_setup_colmv_buf(hal, syn);
    if (ret)
        return MPP_ERR_NOMEM;

    {
        MppFrame mframe = NULL;
        RK_U32 ver_virstride;

        mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.CurrPic.Index7Bits,
                              SLOT_FRAME_PTR, &mframe);
        stride_y = mpp_frame_get_hor_stride(mframe);
        ver_virstride = mpp_frame_get_ver_stride(mframe);
        stride_uv = stride_y;
        virstrid_y = ver_virstride * stride_y;
        hw_regs->common.reg013.h26x_error_mode = 1;
        hw_regs->common.reg021.error_deb_en = 1;
        hw_regs->common.reg021.inter_error_prc_mode = 0;
        hw_regs->common.reg021.error_intra_mode = 1;

        hw_regs->common.reg017.slice_num = dxva_cxt->slice_count;
        hw_regs->h265d_param.reg64.h26x_rps_mode = 0;
        hw_regs->h265d_param.reg64.h26x_frame_orslice = 0;
        hw_regs->h265d_param.reg64.h26x_stream_mode = 0;

        if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe))) {
            RK_U32 fbc_hdr_stride = mpp_frame_get_fbc_hdr_stride(mframe);
            RK_U32 fbd_offset = MPP_ALIGN(fbc_hdr_stride * (ver_virstride + 64) / 16, SZ_4K);

            hw_regs->common.reg012.fbc_e = 1;
            hw_regs->common.reg018.y_hor_virstride = fbc_hdr_stride >> 4;
            hw_regs->common.reg019.uv_hor_virstride = fbc_hdr_stride >> 4;
            hw_regs->common.reg020_fbc_payload_off.payload_st_offset = fbd_offset >> 4;
        } else {
            hw_regs->common.reg012.fbc_e = 0;
            hw_regs->common.reg018.y_hor_virstride = stride_y >> 4;
            hw_regs->common.reg019.uv_hor_virstride = stride_uv >> 4;
            hw_regs->common.reg020_y_virstride.y_virstride = virstrid_y >> 4;
        }
    }
    mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.CurrPic.Index7Bits,
                          SLOT_BUFFER, &framebuf);
    hw_regs->common_addr.reg130_decout_base  = mpp_buffer_get_fd(framebuf); //just index need map
    /*if out_base is equal to zero it means this frame may error
    we return directly add by csy*/

    if (hw_regs->common_addr.reg130_decout_base == 0) {
        return 0;
    }
    fd =  mpp_buffer_get_fd(framebuf);
    hw_regs->common_addr.reg130_decout_base = fd;
    mv_buf = hal_bufs_get_buf(reg_ctx->cmv_bufs, dxva_cxt->pp.CurrPic.Index7Bits);
    hw_regs->common_addr.reg131_colmv_cur_base = mpp_buffer_get_fd(mv_buf->buf[0]);

    hw_regs->h265d_param.reg65.cur_top_poc = dxva_cxt->pp.CurrPicOrderCntVal;

    mpp_buf_slot_get_prop(reg_ctx->packet_slots, syn->dec.input, SLOT_BUFFER,
                          &streambuf);
    if ( dxva_cxt->bitstream == NULL) {
        dxva_cxt->bitstream = mpp_buffer_get_ptr(streambuf);
    }
#ifdef HW_RPS
    hw_regs->h265d_param.reg103.ref_pic_layer_same_with_cur = 0xffff;
    hal_h265d_slice_hw_rps(syn->dec.syntax.data, rps_ptr, reg_ctx->sw_rps_buf, reg_ctx->fast_mode);
#else
    hw_regs->sw_sysctrl.sw_h26x_rps_mode = 1;
    hal_h265d_slice_output_rps(syn->dec.syntax.data, rps_ptr);
#endif

    /* cabac table */
    hw_regs->h265d_addr.reg197_cabactbl_base    = reg_ctx->bufs_fd;
    /* pps */
    hw_regs->h265d_addr.reg161_pps_base         = reg_ctx->bufs_fd;
    hw_regs->h265d_addr.reg163_rps_base         = reg_ctx->bufs_fd;

    hw_regs->common_addr.reg128_rlc_base        = mpp_buffer_get_fd(streambuf);
    hw_regs->common_addr.reg129_rlcwrite_base   = mpp_buffer_get_fd(streambuf);
    stream_buf_size                             = mpp_buffer_get_size(streambuf);
    hw_regs->common.reg016_str_len              = ((dxva_cxt->bitstream_size + 15)
                                                   & (~15)) + 64;
    hw_regs->common.reg016_str_len = stream_buf_size > hw_regs->common.reg016_str_len ?
                                     hw_regs->common.reg016_str_len : stream_buf_size;

    aglin_offset =  hw_regs->common.reg016_str_len - dxva_cxt->bitstream_size;
    if (aglin_offset > 0) {
        memset((void *)(dxva_cxt->bitstream + dxva_cxt->bitstream_size), 0,
               aglin_offset);
    }
    hw_regs->common.reg010.dec_e                = 1;
    hw_regs->common.reg012.colmv_compress_en = reg_ctx->hw_info ?
                                               reg_ctx->hw_info->cap_colmv_compress : 0;

    hw_regs->common.reg024.cabac_err_en_lowbits = 0xffffdfff;
    hw_regs->common.reg025.cabac_err_en_highbits = 0x3ffbf9ff;

    hw_regs->common.reg011.dec_clkgate_e    = 1;
    hw_regs->common.reg011.err_head_fill_e  = 1;
    hw_regs->common.reg011.err_colmv_fill_e = 1;

    hw_regs->common.reg026.inter_auto_gating_e = 1;
    hw_regs->common.reg026.filterd_auto_gating_e = 1;
    hw_regs->common.reg026.strmd_auto_gating_e = 1;
    hw_regs->common.reg026.mcp_auto_gating_e = 1;
    hw_regs->common.reg026.busifd_auto_gating_e = 1;
    hw_regs->common.reg026.dec_ctrl_auto_gating_e = 1;
    hw_regs->common.reg026.intra_auto_gating_e = 1;
    hw_regs->common.reg026.mc_auto_gating_e = 1;
    hw_regs->common.reg026.transd_auto_gating_e = 1;
    hw_regs->common.reg026.sram_auto_gating_e = 1;
    hw_regs->common.reg026.cru_auto_gating_e = 1;
    hw_regs->common.reg026.reg_cfg_gating_en = 1;
    hw_regs->common.reg032_timeout_threshold = 0x3ffff;

    valid_ref = hw_regs->common_addr.reg130_decout_base;
    reg_ctx->error_index[syn->dec.reg_index] = dxva_cxt->pp.CurrPic.Index7Bits;
    hw_regs->common_addr.reg132_error_ref_base = valid_ref;

    memset(&hw_regs->highpoc.reg205, 0, sizeof(RK_U32));

    for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dxva_cxt->pp.RefPicList); i++) {
        if (dxva_cxt->pp.RefPicList[i].bPicEntry != 0xff &&
            dxva_cxt->pp.RefPicList[i].bPicEntry != 0x7f) {

            MppFrame mframe = NULL;
            hw_regs->h265d_param.reg67_82_ref_poc[i] = dxva_cxt->pp.PicOrderCntValList[i];
            mpp_buf_slot_get_prop(reg_ctx->slots,
                                  dxva_cxt->pp.RefPicList[i].Index7Bits,
                                  SLOT_BUFFER, &framebuf);
            mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.RefPicList[i].Index7Bits,
                                  SLOT_FRAME_PTR, &mframe);
            if (framebuf != NULL) {
                hw_regs->h265d_addr.reg164_179_ref_base[i] = mpp_buffer_get_fd(framebuf);
                valid_ref = hw_regs->h265d_addr.reg164_179_ref_base[i];
                // mpp_log("cur poc %d, ref poc %d", dxva_cxt->pp.current_poc, dxva_cxt->pp.PicOrderCntValList[i]);
                if ((pocdistance(dxva_cxt->pp.PicOrderCntValList[i], dxva_cxt->pp.current_poc) < distance)
                    && (!mpp_frame_get_errinfo(mframe))) {
                    distance = pocdistance(dxva_cxt->pp.PicOrderCntValList[i], dxva_cxt->pp.current_poc);
                    hw_regs->common_addr.reg132_error_ref_base = hw_regs->h265d_addr.reg164_179_ref_base[i];
                    reg_ctx->error_index[syn->dec.reg_index] = dxva_cxt->pp.RefPicList[i].Index7Bits;
                    hw_regs->common.reg021.error_intra_mode = 0;

                }
            } else {
                hw_regs->h265d_addr.reg164_179_ref_base[i] = valid_ref;
            }

            mv_buf = hal_bufs_get_buf(reg_ctx->cmv_bufs, dxva_cxt->pp.RefPicList[i].Index7Bits);
            hw_regs->h265d_addr.reg181_196_colmv_base[i] = mpp_buffer_get_fd(mv_buf->buf[0]);

            SET_REF_VALID(hw_regs->h265d_param, i, 1);
        }
    }

    if ((reg_ctx->error_index[syn->dec.reg_index] == dxva_cxt->pp.CurrPic.Index7Bits) &&
        !dxva_cxt->pp.IntraPicFlag) {
        h265h_dbg(H265H_DBG_TASK_ERR, "current frm may be err, should skip process");
        syn->dec.flags.ref_err = 1;
        return MPP_OK;
    }

    for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dxva_cxt->pp.RefPicList); i++) {

        if (dxva_cxt->pp.RefPicList[i].bPicEntry != 0xff &&
            dxva_cxt->pp.RefPicList[i].bPicEntry != 0x7f) {
            MppFrame mframe = NULL;

            mpp_buf_slot_get_prop(reg_ctx->slots,
                                  dxva_cxt->pp.RefPicList[i].Index7Bits,
                                  SLOT_BUFFER, &framebuf);

            mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.RefPicList[i].Index7Bits,
                                  SLOT_FRAME_PTR, &mframe);

            if (framebuf == NULL || mpp_frame_get_errinfo(mframe)) {
                mv_buf = hal_bufs_get_buf(reg_ctx->cmv_bufs, reg_ctx->error_index[syn->dec.reg_index]);
                hw_regs->h265d_addr.reg164_179_ref_base[i] = hw_regs->common_addr.reg132_error_ref_base;
                hw_regs->h265d_addr.reg181_196_colmv_base[i] = mpp_buffer_get_fd(mv_buf->buf[0]);
            }
        } else {
            mv_buf = hal_bufs_get_buf(reg_ctx->cmv_bufs, reg_ctx->error_index[syn->dec.reg_index]);
            hw_regs->h265d_addr.reg164_179_ref_base[i] = hw_regs->common_addr.reg132_error_ref_base;
            hw_regs->h265d_addr.reg181_196_colmv_base[i] = mpp_buffer_get_fd(mv_buf->buf[0]);
            /* mark 3 to differ from current frame */
            if (reg_ctx->error_index[syn->dec.reg_index] == dxva_cxt->pp.CurrPic.Index7Bits)
                SET_POC_HIGNBIT_INFO(hw_regs->highpoc, i, poc_highbit, 3);
        }
    }
    hal_h265d_v382_output_pps_packet(hal, syn->dec.syntax.data);

    mpp_dev_set_reg_offset(reg_ctx->dev, 161, reg_ctx->spspps_offset);
    /* rps */
    mpp_dev_set_reg_offset(reg_ctx->dev, 163, reg_ctx->rps_offset);

    hw_regs->common.reg013.cur_pic_is_idr = dxva_cxt->pp.IdrPicFlag;//p_hal->slice_long->idr_flag;

    hw_regs->common.reg011.buf_empty_en = 1;

    hal_h265d_rcb_info_update(hal, dxva_cxt, hw_regs, width, height);
    vdpu382_setup_rcb(&hw_regs->common_addr, reg_ctx->dev, reg_ctx->fast_mode ?
                      reg_ctx->rcb_buf[syn->dec.reg_index] : reg_ctx->rcb_buf[0],
                      (Vdpu382RcbInfo*)reg_ctx->rcb_info);
    {
        MppFrame mframe = NULL;

        mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.CurrPic.Index7Bits,
                              SLOT_FRAME_PTR, &mframe);

        if (mpp_frame_get_thumbnail_en(mframe)) {
            hw_regs->h265d_addr.reg198_scale_down_luma_base =
                hw_regs->common_addr.reg130_decout_base;
            hw_regs->h265d_addr.reg199_scale_down_chorme_base =
                hw_regs->common_addr.reg130_decout_base;
            vdpu382_setup_down_scale(mframe, reg_ctx->dev, &hw_regs->common);
        } else {
            hw_regs->h265d_addr.reg198_scale_down_luma_base = 0;
            hw_regs->h265d_addr.reg199_scale_down_chorme_base = 0;
            hw_regs->common.reg012.scale_down_en = 0;
        }
    }
    vdpu382_setup_statistic(&hw_regs->common, &hw_regs->statistic);
    mpp_buffer_sync_end(reg_ctx->bufs);

    return ret;
}